

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

int sat_solver_decision(sat_solver *s,lit l)

{
  int iVar1;
  
  if (s->qtail != s->qhead) {
    __assert_fail("s->qtail == s->qhead",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x289,"int sat_solver_decision(sat_solver *, lit)");
  }
  if (s->assigns[l >> 1] == '\x03') {
    veci_push(&s->trail_lim,s->qtail);
    iVar1 = sat_solver_enqueue(s,l,0);
    return iVar1;
  }
  __assert_fail("var_value(s, lit_var(l)) == varX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                ,0x28a,"int sat_solver_decision(sat_solver *, lit)");
}

Assistant:

static inline int sat_solver_decision(sat_solver* s, lit l){
    assert(s->qtail == s->qhead);
    assert(var_value(s, lit_var(l)) == varX);
#ifdef VERBOSEDEBUG
    printf(L_IND"assume("L_LIT")  ", L_ind, L_lit(l));
    printf( "act = %.20f\n", s->activity[lit_var(l)] );
#endif
    veci_push(&s->trail_lim,s->qtail);
    return sat_solver_enqueue(s,l,0);
}